

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeglobals.cpp
# Opt level: O2

QString * __thiscall
QMakeGlobals::getEnv(QString *__return_storage_ptr__,QMakeGlobals *this,QString *var)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_50;
  QArrayDataPointer<char> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QString::toLocal8Bit((QByteArray *)&local_50,var);
  qgetenv((char *)&local_38);
  QString::fromLocal8Bit<void>(__return_storage_ptr__,(QByteArray *)&local_38);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QMakeGlobals::getEnv(const QString &var) const
{
#ifdef PROEVALUATOR_SETENV
    return environment.value(var);
#else
    return QString::fromLocal8Bit(qgetenv(var.toLocal8Bit().constData()));
#endif
}